

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsMessageCopy(HelicsMessage source_message,HelicsMessage dest_message,HelicsError *err)

{
  Message *this;
  Message *__str;
  HelicsMessage in_RDX;
  SmallBuffer *in_RSI;
  SmallBuffer *in_RDI;
  Message *mess_dest;
  Message *mess_src;
  HelicsError *in_stack_ffffffffffffffe0;
  
  this = getMessageObj(in_RDX,in_stack_ffffffffffffffe0);
  if ((this != (Message *)0x0) &&
     (__str = getMessageObj(in_RDX,(HelicsError *)this), __str != (Message *)0x0)) {
    helics::SmallBuffer::operator=(in_RDI,in_RSI);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    (__str->time).internalTimeCode = (this->time).internalTimeCode;
    __str->messageID = this->messageID;
    __str->flags = this->flags;
  }
  return;
}

Assistant:

void helicsMessageCopy(HelicsMessage source_message, HelicsMessage dest_message, HelicsError* err)
{
    auto* mess_src = getMessageObj(source_message, err);
    if (mess_src == nullptr) {
        return;
    }
    auto* mess_dest = getMessageObj(dest_message, err);
    if (mess_dest == nullptr) {
        return;
    }
    mess_dest->data = mess_src->data;
    mess_dest->dest = mess_src->dest;
    mess_dest->original_source = mess_src->original_source;
    mess_dest->source = mess_src->source;
    mess_dest->original_dest = mess_src->original_dest;
    mess_dest->time = mess_src->time;
    mess_dest->messageID = mess_src->messageID;
    mess_dest->flags = mess_src->flags;
}